

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

void lyplg_clean_(void)

{
  context_refcount = context_refcount - 1;
  if (context_refcount != 0) {
    return;
  }
  ly_set_erase(&plugins_types,(_func_void_void_ptr *)0x0);
  ly_set_erase(&plugins_extensions,(_func_void_void_ptr *)0x0);
  ly_set_erase(&plugins_handlers,lyplg_close_cb);
  return;
}

Assistant:

static void
lyplg_clean_(void)
{
    if (--context_refcount) {
        /* there is still some other context, do not remove the plugins */
        return;
    }

    ly_set_erase(&plugins_types, NULL);
    ly_set_erase(&plugins_extensions, NULL);
    ly_set_erase(&plugins_handlers, lyplg_close_cb);
}